

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_init_read_transformations(png_structrp png_ptr)

{
  png_uint_16 *ppVar1;
  byte *pbVar2;
  png_byte pVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  png_colorp ppVar8;
  png_bytep ppVar9;
  png_bytep ppVar10;
  bool bVar11;
  undefined1 uVar12;
  png_uint_16 pVar13;
  byte bVar14;
  byte bVar15;
  png_uint_16 pVar16;
  int iVar17;
  int iVar18;
  png_fixed_point pVar19;
  png_fixed_point pVar20;
  png_uint_16 pVar21;
  ushort uVar22;
  uint uVar23;
  int i;
  ulong uVar24;
  png_byte *ppVar25;
  png_fixed_point a;
  long lVar26;
  ulong uVar27;
  long lVar28;
  byte bVar29;
  png_bytep ppVar30;
  bool bVar31;
  bool bVar32;
  png_fixed_point gtest;
  byte local_3a;
  byte local_39;
  uint local_38;
  png_fixed_point local_34;
  
  pVar20 = png_ptr->screen_gamma;
  pVar19 = (png_ptr->colorspace).gamma;
  if (pVar19 == 0) {
    if (pVar20 == 0) {
      pVar20 = 100000;
      (png_ptr->colorspace).gamma = 100000;
      goto LAB_001a055f;
    }
    pVar20 = png_reciprocal(pVar20);
    (png_ptr->colorspace).gamma = pVar20;
LAB_001a0565:
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
LAB_001a056c:
    pbVar2 = (byte *)((long)&png_ptr->transformations + 1);
    *pbVar2 = *pbVar2 & 0xdf;
  }
  else {
    if (pVar20 == 0) {
      pVar20 = png_reciprocal(pVar19);
LAB_001a055f:
      png_ptr->screen_gamma = pVar20;
      goto LAB_001a0565;
    }
    iVar17 = png_muldiv(&local_34,pVar19,pVar20,100000);
    if (iVar17 != 0) {
      iVar17 = png_gamma_significant(local_34);
      ppVar1 = &(png_ptr->colorspace).flags;
      *(byte *)ppVar1 = (byte)*ppVar1 | 1;
      if (iVar17 != 0) goto LAB_001a054b;
      goto LAB_001a056c;
    }
    ppVar1 = &(png_ptr->colorspace).flags;
    *(byte *)ppVar1 = (byte)*ppVar1 | 1;
LAB_001a054b:
    pbVar2 = (byte *)((long)&png_ptr->transformations + 1);
    *pbVar2 = *pbVar2 | 0x20;
  }
  if ((png_ptr->transformations & 0x40080) == 0x40000) {
    png_ptr->transformations = png_ptr->transformations & 0xfd7ffe7f;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
    png_ptr->num_trans = 0;
  }
  iVar17 = png_gamma_significant(png_ptr->screen_gamma);
  if (iVar17 == 0) {
    pbVar2 = (byte *)((long)&png_ptr->transformations + 2);
    *pbVar2 = *pbVar2 & 0x7f;
    pbVar2 = (byte *)((long)&png_ptr->flags + 1);
    *pbVar2 = *pbVar2 & 0xdf;
  }
  if ((png_ptr->transformations & 0x600000) != 0) {
    png_colorspace_set_rgb_coefficients(png_ptr);
  }
  uVar23 = png_ptr->transformations;
  if ((uVar23 >> 8 & 1) == 0) {
    if ((((~uVar23 & 0x4080) == 0) &&
        (pVar16 = (png_ptr->background).red, pVar16 == (png_ptr->background).green)) &&
       (pVar16 == (png_ptr->background).blue)) {
      pbVar2 = (byte *)((long)&png_ptr->mode + 1);
      *pbVar2 = *pbVar2 | 8;
      (png_ptr->background).gray = pVar16;
    }
  }
  else if ((png_ptr->color_type & 2) == 0) {
    pbVar2 = (byte *)((long)&png_ptr->mode + 1);
    *pbVar2 = *pbVar2 | 8;
  }
  bVar14 = png_ptr->color_type;
  if (bVar14 == 3) {
    uVar27 = (ulong)png_ptr->num_trans;
    if (uVar27 == 0) {
      bVar11 = true;
      bVar31 = true;
    }
    else {
      bVar31 = false;
      bVar11 = false;
      uVar24 = 1;
      do {
        bVar32 = bVar11;
        if (png_ptr->trans_alpha[uVar24 - 1] != 0xff) {
          bVar11 = true;
          bVar32 = true;
          if (png_ptr->trans_alpha[uVar24 - 1] != '\0') break;
        }
        bVar11 = bVar32;
        bVar31 = uVar27 <= uVar24;
        bVar32 = uVar24 != uVar27;
        uVar24 = uVar24 + 1;
      } while (bVar32);
      bVar11 = !bVar11;
    }
    if (bVar31) {
      png_ptr->transformations = uVar23 & 0xff7fffff;
      pbVar2 = (byte *)((long)&png_ptr->flags + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      if (bVar11) {
        png_ptr->transformations = uVar23 & 0xff7ffe7f;
      }
    }
    uVar23 = png_ptr->transformations;
    if ((~uVar23 & 0x1100) == 0) {
      ppVar8 = png_ptr->palette;
      bVar14 = (png_ptr->background).index;
      (png_ptr->background).red = (ushort)ppVar8[bVar14].red;
      (png_ptr->background).green = (ushort)ppVar8[bVar14].green;
      (png_ptr->background).blue = (ushort)ppVar8[bVar14].blue;
      if ((uVar23 & 0x2080000) == 0x80000 && uVar27 != 0) {
        ppVar9 = png_ptr->trans_alpha;
        uVar24 = 0;
        do {
          ppVar9[uVar24] = ~ppVar9[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar27 != uVar24);
      }
    }
  }
  else {
    if ((bVar14 & 4) == 0) {
      pbVar2 = (byte *)((long)&png_ptr->flags + 1);
      *pbVar2 = *pbVar2 & 0xdf;
      png_ptr->transformations = uVar23 & 0xff7fffff;
      if (png_ptr->num_trans == 0) {
        png_ptr->transformations = uVar23 & 0xff7ffe7f;
      }
    }
    uVar23 = png_ptr->transformations;
    if ((bVar14 & 2) == 0 && (~uVar23 & 0x1100) == 0) {
      pVar16 = (png_ptr->background).gray;
      pVar21 = (png_ptr->trans_color).gray;
      pVar3 = png_ptr->bit_depth;
      if (pVar3 == '\x04') {
        pVar16 = pVar16 * 0x11;
        pVar21 = pVar21 * 0x11;
      }
      else if (pVar3 == '\x02') {
        pVar16 = pVar16 * 0x55;
        pVar21 = pVar21 * 0x55;
      }
      else if (pVar3 == '\x01') {
        pVar16 = pVar16 * 0xff;
        pVar21 = pVar21 * 0xff;
      }
      (png_ptr->background).blue = pVar16;
      (png_ptr->background).green = pVar16;
      (png_ptr->background).red = pVar16;
      if ((uVar23 >> 0x19 & 1) == 0) {
        (png_ptr->trans_color).blue = pVar21;
        (png_ptr->trans_color).green = pVar21;
        (png_ptr->trans_color).red = pVar21;
      }
    }
  }
  uVar23 = png_ptr->transformations;
  if (((uVar23 & 0x380) == 0x280) && (png_ptr->bit_depth != '\x10')) {
    (png_ptr->background).red =
         (png_uint_16)((uint)(png_ptr->background).red * 0xff + 0x807f >> 0x10);
    (png_ptr->background).green =
         (png_uint_16)((uint)(png_ptr->background).green * 0xff + 0x807f >> 0x10);
    (png_ptr->background).blue =
         (png_uint_16)((uint)(png_ptr->background).blue * 0xff + 0x807f >> 0x10);
    (png_ptr->background).gray =
         (png_uint_16)((uint)(png_ptr->background).gray * 0xff + 0x807f >> 0x10);
  }
  if (((uVar23 & 0x180) == 0x80 && (uVar23 & 0x4000400) != 0) && (png_ptr->bit_depth == '\x10')) {
    (png_ptr->background).red = (png_ptr->background).red * 0x101;
    iVar17._0_2_ = (png_ptr->background).green;
    iVar17._2_2_ = (png_ptr->background).blue;
    iVar18 = *(int *)&(png_ptr->background).gray;
    (png_ptr->background).green = (short)(iVar17 << 8) + (undefined2)iVar17;
    (png_ptr->background).blue = (png_ptr->background).blue * 0x101;
    (png_ptr->background).gray = (short)(iVar18 << 8) + (short)iVar18;
  }
  (png_ptr->background_1).gray = (png_ptr->background).gray;
  uVar12 = (png_ptr->background).field_0x1;
  pVar16 = (png_ptr->background).red;
  pVar21 = (png_ptr->background).green;
  pVar13 = (png_ptr->background).blue;
  (png_ptr->background_1).index = (png_ptr->background).index;
  (png_ptr->background_1).field_0x1 = uVar12;
  (png_ptr->background_1).red = pVar16;
  (png_ptr->background_1).green = pVar21;
  (png_ptr->background_1).blue = pVar13;
  if (((((uVar23 >> 0xd & 1) == 0) &&
       (((uVar23 & 0x600000) == 0 ||
        ((iVar17 = png_gamma_significant((png_ptr->colorspace).gamma), iVar17 == 0 &&
         (iVar17 = png_gamma_significant(png_ptr->screen_gamma), iVar17 == 0)))))) &&
      (((png_ptr->transformations & 0x80) == 0 ||
       (((iVar17 = png_gamma_significant((png_ptr->colorspace).gamma), iVar17 == 0 &&
         (iVar17 = png_gamma_significant(png_ptr->screen_gamma), iVar17 == 0)) &&
        ((png_ptr->background_gamma_type != '\x03' ||
         (iVar17 = png_gamma_significant(png_ptr->background_gamma), iVar17 == 0)))))))) &&
     (((png_ptr->transformations & 0x800000) == 0 ||
      (iVar17 = png_gamma_significant(png_ptr->screen_gamma), iVar17 == 0)))) {
    if (((png_ptr->transformations & 0x80) != 0) && (png_ptr->color_type == '\x03')) {
      uVar4 = png_ptr->num_trans;
      if ((ulong)uVar4 != 0) {
        uVar5 = (png_ptr->background).red;
        uVar6 = (png_ptr->background).green;
        uVar7 = (png_ptr->background).blue;
        ppVar25 = &png_ptr->palette->blue;
        uVar27 = 0;
        do {
          ppVar9 = png_ptr->trans_alpha;
          bVar14 = ppVar9[uVar27];
          if (bVar14 != 0xff) {
            if (bVar14 == 0) {
              ((png_color *)(ppVar25 + -2))->red = (byte)uVar5;
              ppVar25[-1] = (byte)uVar6;
              *ppVar25 = (byte)uVar7;
            }
            else {
              uVar22 = (ushort)((png_color *)(ppVar25 + -2))->red * (ushort)bVar14 + 0x80 +
                       (ushort)(byte)~bVar14 * (uVar5 & 0xff);
              ((png_color *)(ppVar25 + -2))->red = (byte)((uint)(uVar22 >> 8) + (uint)uVar22 >> 8);
              uVar23 = (uint)ppVar25[-1] * (uint)ppVar9[uVar27] + 0x80 +
                       (ppVar9[uVar27] ^ 0xff) * (uVar6 & 0xff) & 0xffff;
              ppVar25[-1] = (byte)((uVar23 >> 8) + uVar23 >> 8);
              uVar23 = (uint)*ppVar25 * (uint)ppVar9[uVar27] + 0x80 +
                       (ppVar9[uVar27] ^ 0xff) * (uint)(uVar7 & 0xff) & 0xffff;
              *ppVar25 = (byte)((uVar23 >> 8) + uVar23 >> 8);
            }
          }
          uVar27 = uVar27 + 1;
          ppVar25 = ppVar25 + 3;
        } while (uVar4 != uVar27);
      }
      *(byte *)&png_ptr->transformations = (byte)png_ptr->transformations & 0x7f;
    }
    goto LAB_001a1050;
  }
  png_build_gamma_table(png_ptr,(uint)png_ptr->bit_depth);
  uVar23 = png_ptr->transformations;
  if (-1 < (char)uVar23) {
    if ((png_ptr->color_type == '\x03') && (((byte)(uVar23 >> 0xc) & (uVar23 & 0x600000) != 0) == 0)
       ) {
      uVar4 = png_ptr->num_palette;
      if ((ulong)uVar4 != 0) {
        ppVar8 = png_ptr->palette;
        ppVar9 = png_ptr->gamma_table;
        lVar26 = 0;
        do {
          (&ppVar8->red)[lVar26] = ppVar9[(&ppVar8->red)[lVar26]];
          (&ppVar8->green)[lVar26] = ppVar9[(&ppVar8->green)[lVar26]];
          (&ppVar8->blue)[lVar26] = ppVar9[(&ppVar8->blue)[lVar26]];
          lVar26 = lVar26 + 3;
        } while ((ulong)uVar4 * 3 != lVar26);
      }
      png_ptr->transformations = uVar23 & 0xffffdf7f;
    }
    goto LAB_001a1050;
  }
  if ((uVar23 & 0x600000) != 0) {
    png_warning(png_ptr,"libpng does not support gamma+background+rgb_to_gray");
  }
  if (png_ptr->color_type != '\x03') {
    pVar3 = png_ptr->background_gamma_type;
    if (pVar3 == '\x03') {
      pVar20 = png_reciprocal(png_ptr->background_gamma);
      a = png_ptr->background_gamma;
      pVar19 = png_ptr->screen_gamma;
LAB_001a0ca9:
      pVar19 = png_reciprocal2(a,pVar19);
    }
    else {
      if (pVar3 == '\x02') {
        pVar20 = png_reciprocal((png_ptr->colorspace).gamma);
        pVar19 = png_ptr->screen_gamma;
        a = (png_ptr->colorspace).gamma;
        goto LAB_001a0ca9;
      }
      if (pVar3 != '\x01') {
        png_error(png_ptr,"invalid background gamma type");
      }
      pVar20 = png_ptr->screen_gamma;
      pVar19 = 100000;
    }
    iVar17 = png_gamma_significant(pVar20);
    iVar18 = png_gamma_significant(pVar19);
    if (iVar17 != 0) {
      pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).gray,pVar20);
      (png_ptr->background_1).gray = pVar16;
    }
    if (iVar18 != 0) {
      pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).gray,pVar19);
      (png_ptr->background).gray = pVar16;
    }
    uVar4 = (png_ptr->background).red;
    if (((uVar4 == (png_ptr->background).green) && (uVar4 == (png_ptr->background).blue)) &&
       (uVar5 = (png_ptr->background).gray, uVar4 == uVar5)) {
      pVar16 = (png_ptr->background_1).gray;
      (png_ptr->background_1).blue = pVar16;
      (png_ptr->background_1).green = pVar16;
      (png_ptr->background_1).red = pVar16;
      (png_ptr->background).blue = uVar5;
      (png_ptr->background).green = uVar5;
      (png_ptr->background).red = uVar5;
    }
    else {
      if (iVar17 != 0) {
        pVar16 = png_gamma_correct(png_ptr,(uint)uVar4,pVar20);
        (png_ptr->background_1).red = pVar16;
        pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).green,pVar20);
        (png_ptr->background_1).green = pVar16;
        pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).blue,pVar20);
        (png_ptr->background_1).blue = pVar16;
      }
      if (iVar18 != 0) {
        pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).red,pVar19);
        (png_ptr->background).red = pVar16;
        pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).green,pVar19);
        (png_ptr->background).green = pVar16;
        pVar16 = png_gamma_correct(png_ptr,(uint)(png_ptr->background).blue,pVar19);
        (png_ptr->background).blue = pVar16;
      }
    }
    png_ptr->background_gamma_type = '\x01';
    goto LAB_001a1050;
  }
  ppVar8 = png_ptr->palette;
  uVar4 = png_ptr->num_palette;
  pVar3 = png_ptr->background_gamma_type;
  pVar20 = 100000;
  if (pVar3 == '\x01') {
    pVar19 = png_ptr->screen_gamma;
LAB_001a0e28:
    iVar17 = png_gamma_significant(pVar20);
    local_38 = (uint)(png_ptr->background).red;
    if (iVar17 == 0) {
      local_39 = (byte)(png_ptr->background).green;
      local_3a = (byte)(png_ptr->background).blue;
    }
    else {
      bVar14 = png_gamma_8bit_correct(local_38,pVar20);
      local_38 = (uint)bVar14;
      local_39 = png_gamma_8bit_correct((uint)(png_ptr->background).green,pVar20);
      local_3a = png_gamma_8bit_correct((uint)(png_ptr->background).blue,pVar20);
    }
    iVar17 = png_gamma_significant(pVar19);
    uVar23 = (uint)(png_ptr->background).red;
    if (iVar17 == 0) {
      bVar14 = (byte)(png_ptr->background).green;
      bVar15 = (byte)(png_ptr->background).blue;
    }
    else {
      bVar14 = png_gamma_8bit_correct(uVar23,pVar19);
      uVar23 = (uint)bVar14;
      bVar14 = png_gamma_8bit_correct((uint)(png_ptr->background).green,pVar19);
      bVar15 = png_gamma_8bit_correct((uint)(png_ptr->background).blue,pVar19);
    }
  }
  else {
    if (pVar3 == '\x03') {
      pVar19 = png_reciprocal(png_ptr->background_gamma);
      pVar20 = png_reciprocal2(png_ptr->background_gamma,png_ptr->screen_gamma);
      goto LAB_001a0e28;
    }
    pVar19 = 100000;
    if (pVar3 != '\x02') goto LAB_001a0e28;
    uVar5 = (png_ptr->background).red;
    ppVar9 = png_ptr->gamma_table;
    ppVar30 = png_ptr->gamma_to_1;
    local_38._0_1_ = ppVar9[uVar5];
    uVar6 = (png_ptr->background).green;
    local_39 = ppVar9[uVar6];
    uVar7 = (png_ptr->background).blue;
    local_3a = ppVar9[uVar7];
    uVar23 = (uint)ppVar30[uVar5];
    bVar14 = ppVar30[uVar6];
    bVar15 = ppVar30[uVar7];
  }
  if ((ulong)uVar4 != 0) {
    ppVar25 = &ppVar8->blue;
    uVar27 = 0;
    do {
      if (uVar27 < png_ptr->num_trans) {
        ppVar9 = png_ptr->trans_alpha;
        bVar29 = ppVar9[uVar27];
        if (bVar29 == 0xff) goto LAB_001a0f3a;
        if (bVar29 != 0) {
          ppVar30 = png_ptr->gamma_from_1;
          ppVar10 = png_ptr->gamma_to_1;
          iVar17 = (uint)(byte)~bVar29 * (uVar23 & 0xff) +
                   (uint)ppVar10[((png_color *)(ppVar25 + -2))->red] * (uint)bVar29;
          ((png_color *)(ppVar25 + -2))->red =
               ppVar30[iVar17 + (iVar17 + 0x80U >> 8 & 0xff) + 0x80 >> 8 & 0xff];
          iVar17 = (ppVar9[uVar27] ^ 0xff) * (uint)bVar14 +
                   (uint)ppVar10[ppVar25[-1]] * (uint)ppVar9[uVar27];
          ppVar25[-1] = ppVar30[(iVar17 + 0x80U >> 8 & 0xff) + iVar17 + 0x80 >> 8 & 0xff];
          iVar17 = (ppVar9[uVar27] ^ 0xff) * (uint)bVar15 +
                   (uint)ppVar10[*ppVar25] * (uint)ppVar9[uVar27];
          uVar24 = (ulong)(iVar17 + (iVar17 + 0x80U >> 8 & 0xff) + 0x80 >> 8 & 0xff);
          goto LAB_001a0f60;
        }
        ((png_color *)(ppVar25 + -2))->red = (byte)local_38;
        ppVar25[-1] = local_39;
        bVar29 = local_3a;
      }
      else {
LAB_001a0f3a:
        ppVar30 = png_ptr->gamma_table;
        ((png_color *)(ppVar25 + -2))->red = ppVar30[((png_color *)(ppVar25 + -2))->red];
        ppVar25[-1] = ppVar30[ppVar25[-1]];
        uVar24 = (ulong)*ppVar25;
LAB_001a0f60:
        bVar29 = ppVar30[uVar24];
      }
      *ppVar25 = bVar29;
      uVar27 = uVar27 + 1;
      ppVar25 = ppVar25 + 3;
    } while (uVar4 != uVar27);
  }
  png_ptr->transformations = png_ptr->transformations & 0xffffdf7f;
LAB_001a1050:
  if (((png_ptr->transformations & 0x1008) == 8) && (png_ptr->color_type == '\x03')) {
    uVar4 = png_ptr->num_palette;
    pVar3 = (png_ptr->sig_bit).red;
    png_ptr->transformations = png_ptr->transformations & 0xffffeff7;
    lVar26 = (ulong)uVar4 * 3;
    if (uVar4 != 0 && (byte)(pVar3 - 1) < 7) {
      ppVar8 = png_ptr->palette;
      lVar28 = 0;
      do {
        (&ppVar8->red)[lVar28] = (&ppVar8->red)[lVar28] >> (8 - pVar3 & 0x1f);
        lVar28 = lVar28 + 3;
      } while (lVar26 != lVar28);
    }
    pVar3 = (png_ptr->sig_bit).green;
    if (uVar4 != 0 && (byte)(pVar3 - 1) < 7) {
      ppVar8 = png_ptr->palette;
      lVar28 = 0;
      do {
        (&ppVar8->green)[lVar28] = (&ppVar8->green)[lVar28] >> (8 - pVar3 & 0x1f);
        lVar28 = lVar28 + 3;
      } while (lVar26 != lVar28);
    }
    pVar3 = (png_ptr->sig_bit).blue;
    if (uVar4 != 0 && (byte)(pVar3 - 1) < 7) {
      ppVar8 = png_ptr->palette;
      lVar28 = 0;
      do {
        (&ppVar8->blue)[lVar28] = (&ppVar8->blue)[lVar28] >> (8 - pVar3 & 0x1f);
        lVar28 = lVar28 + 3;
      } while (lVar26 != lVar28);
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_init_read_transformations(png_structrp png_ptr)
{
   png_debug(1, "in png_init_read_transformations");

   /* This internal function is called from png_read_start_row in pngrutil.c
    * and it is called before the 'rowbytes' calculation is done, so the code
    * in here can change or update the transformations flags.
    *
    * First do updates that do not depend on the details of the PNG image data
    * being processed.
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
   /* Prior to 1.5.4 these tests were performed from png_set_gamma, 1.5.4 adds
    * png_set_alpha_mode and this is another source for a default file gamma so
    * the test needs to be performed later - here.  In addition prior to 1.5.4
    * the tests were repeated for the PALETTE color type here - this is no
    * longer necessary (and doesn't seem to have been necessary before.)
    */
   {
      /* The following temporary indicates if overall gamma correction is
       * required.
       */
      int gamma_correction = 0;

      if (png_ptr->colorspace.gamma != 0) /* has been set */
      {
         if (png_ptr->screen_gamma != 0) /* screen set too */
            gamma_correction = png_gamma_threshold(png_ptr->colorspace.gamma,
                png_ptr->screen_gamma);

         else
            /* Assume the output matches the input; a long time default behavior
             * of libpng, although the standard has nothing to say about this.
             */
            png_ptr->screen_gamma = png_reciprocal(png_ptr->colorspace.gamma);
      }

      else if (png_ptr->screen_gamma != 0)
         /* The converse - assume the file matches the screen, note that this
          * perhaps undesireable default can (from 1.5.4) be changed by calling
          * png_set_alpha_mode (even if the alpha handling mode isn't required
          * or isn't changed from the default.)
          */
         png_ptr->colorspace.gamma = png_reciprocal(png_ptr->screen_gamma);

      else /* neither are set */
         /* Just in case the following prevents any processing - file and screen
          * are both assumed to be linear and there is no way to introduce a
          * third gamma value other than png_set_background with 'UNIQUE', and,
          * prior to 1.5.4
          */
         png_ptr->screen_gamma = png_ptr->colorspace.gamma = PNG_FP_1;

      /* We have a gamma value now. */
      png_ptr->colorspace.flags |= PNG_COLORSPACE_HAVE_GAMMA;

      /* Now turn the gamma transformation on or off as appropriate.  Notice
       * that PNG_GAMMA just refers to the file->screen correction.  Alpha
       * composition may independently cause gamma correction because it needs
       * linear data (e.g. if the file has a gAMA chunk but the screen gamma
       * hasn't been specified.)  In any case this flag may get turned off in
       * the code immediately below if the transform can be handled outside the
       * row loop.
       */
      if (gamma_correction != 0)
         png_ptr->transformations |= PNG_GAMMA;

      else
         png_ptr->transformations &= ~PNG_GAMMA;
   }
#endif

   /* Certain transformations have the effect of preventing other
    * transformations that happen afterward in png_do_read_transformations;
    * resolve the interdependencies here.  From the code of
    * png_do_read_transformations the order is:
    *
    *  1) PNG_EXPAND (including PNG_EXPAND_tRNS)
    *  2) PNG_STRIP_ALPHA (if no compose)
    *  3) PNG_RGB_TO_GRAY
    *  4) PNG_GRAY_TO_RGB iff !PNG_BACKGROUND_IS_GRAY
    *  5) PNG_COMPOSE
    *  6) PNG_GAMMA
    *  7) PNG_STRIP_ALPHA (if compose)
    *  8) PNG_ENCODE_ALPHA
    *  9) PNG_SCALE_16_TO_8
    * 10) PNG_16_TO_8
    * 11) PNG_QUANTIZE (converts to palette)
    * 12) PNG_EXPAND_16
    * 13) PNG_GRAY_TO_RGB iff PNG_BACKGROUND_IS_GRAY
    * 14) PNG_INVERT_MONO
    * 15) PNG_INVERT_ALPHA
    * 16) PNG_SHIFT
    * 17) PNG_PACK
    * 18) PNG_BGR
    * 19) PNG_PACKSWAP
    * 20) PNG_FILLER (includes PNG_ADD_ALPHA)
    * 21) PNG_SWAP_ALPHA
    * 22) PNG_SWAP_BYTES
    * 23) PNG_USER_TRANSFORM [must be last]
    */
#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) == 0)
   {
      /* Stripping the alpha channel happens immediately after the 'expand'
       * transformations, before all other transformation, so it cancels out
       * the alpha handling.  It has the side effect negating the effect of
       * PNG_EXPAND_tRNS too:
       */
      png_ptr->transformations &= ~(PNG_BACKGROUND_EXPAND | PNG_ENCODE_ALPHA |
         PNG_EXPAND_tRNS);
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;

      /* Kill the tRNS chunk itself too.  Prior to 1.5.4 this did not happen
       * so transparency information would remain just so long as it wasn't
       * expanded.  This produces unexpected API changes if the set of things
       * that do PNG_EXPAND_tRNS changes (perfectly possible given the
       * documentation - which says ask for what you want, accept what you
       * get.)  This makes the behavior consistent from 1.5.4:
       */
      png_ptr->num_trans = 0;
   }
#endif /* STRIP_ALPHA supported, no COMPOSE */

#ifdef PNG_READ_ALPHA_MODE_SUPPORTED
   /* If the screen gamma is about 1.0 then the OPTIMIZE_ALPHA and ENCODE_ALPHA
    * settings will have no effect.
    */
   if (png_gamma_significant(png_ptr->screen_gamma) == 0)
   {
      png_ptr->transformations &= ~PNG_ENCODE_ALPHA;
      png_ptr->flags &= ~PNG_FLAG_OPTIMIZE_ALPHA;
   }
#endif

#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
   /* Make sure the coefficients for the rgb to gray conversion are set
    * appropriately.
    */
   if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
      png_colorspace_set_rgb_coefficients(png_ptr);
#endif

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
#if defined(PNG_READ_EXPAND_SUPPORTED) && defined(PNG_READ_BACKGROUND_SUPPORTED)
   /* Detect gray background and attempt to enable optimization for
    * gray --> RGB case.
    *
    * Note:  if PNG_BACKGROUND_EXPAND is set and color_type is either RGB or
    * RGB_ALPHA (in which case need_expand is superfluous anyway), the
    * background color might actually be gray yet not be flagged as such.
    * This is not a problem for the current code, which uses
    * PNG_BACKGROUND_IS_GRAY only to decide when to do the
    * png_do_gray_to_rgb() transformation.
    *
    * TODO: this code needs to be revised to avoid the complexity and
    * interdependencies.  The color type of the background should be recorded in
    * png_set_background, along with the bit depth, then the code has a record
    * of exactly what color space the background is currently in.
    */
   if ((png_ptr->transformations & PNG_BACKGROUND_EXPAND) != 0)
   {
      /* PNG_BACKGROUND_EXPAND: the background is in the file color space, so if
       * the file was grayscale the background value is gray.
       */
      if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) == 0)
         png_ptr->mode |= PNG_BACKGROUND_IS_GRAY;
   }

   else if ((png_ptr->transformations & PNG_COMPOSE) != 0)
   {
      /* PNG_COMPOSE: png_set_background was called with need_expand false,
       * so the color is in the color space of the output or png_set_alpha_mode
       * was called and the color is black.  Ignore RGB_TO_GRAY because that
       * happens before GRAY_TO_RGB.
       */
      if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0)
      {
         if (png_ptr->background.red == png_ptr->background.green &&
             png_ptr->background.red == png_ptr->background.blue)
         {
            png_ptr->mode |= PNG_BACKGROUND_IS_GRAY;
            png_ptr->background.gray = png_ptr->background.red;
         }
      }
   }
#endif /* READ_EXPAND && READ_BACKGROUND */
#endif /* READ_GRAY_TO_RGB */

   /* For indexed PNG data (PNG_COLOR_TYPE_PALETTE) many of the transformations
    * can be performed directly on the palette, and some (such as rgb to gray)
    * can be optimized inside the palette.  This is particularly true of the
    * composite (background and alpha) stuff, which can be pretty much all done
    * in the palette even if the result is expanded to RGB or gray afterward.
    *
    * NOTE: this is Not Yet Implemented, the code behaves as in 1.5.1 and
    * earlier and the palette stuff is actually handled on the first row.  This
    * leads to the reported bug that the palette returned by png_get_PLTE is not
    * updated.
    */
   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      png_init_palette_transformations(png_ptr);

   else
      png_init_rgb_transformations(png_ptr);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) && \
   defined(PNG_READ_EXPAND_16_SUPPORTED)
   if ((png_ptr->transformations & PNG_EXPAND_16) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->transformations & PNG_BACKGROUND_EXPAND) == 0 &&
       png_ptr->bit_depth != 16)
   {
      /* TODO: fix this.  Because the expand_16 operation is after the compose
       * handling the background color must be 8, not 16, bits deep, but the
       * application will supply a 16-bit value so reduce it here.
       *
       * The PNG_BACKGROUND_EXPAND code above does not expand to 16 bits at
       * present, so that case is ok (until do_expand_16 is moved.)
       *
       * NOTE: this discards the low 16 bits of the user supplied background
       * color, but until expand_16 works properly there is no choice!
       */
#     define CHOP(x) (x)=((png_uint_16)PNG_DIV257(x))
      CHOP(png_ptr->background.red);
      CHOP(png_ptr->background.green);
      CHOP(png_ptr->background.blue);
      CHOP(png_ptr->background.gray);
#     undef CHOP
   }
#endif /* READ_BACKGROUND && READ_EXPAND_16 */

#if defined(PNG_READ_BACKGROUND_SUPPORTED) && \
   (defined(PNG_READ_SCALE_16_TO_8_SUPPORTED) || \
   defined(PNG_READ_STRIP_16_TO_8_SUPPORTED))
   if ((png_ptr->transformations & (PNG_16_TO_8|PNG_SCALE_16_TO_8)) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->transformations & PNG_BACKGROUND_EXPAND) == 0 &&
       png_ptr->bit_depth == 16)
   {
      /* On the other hand, if a 16-bit file is to be reduced to 8-bits per
       * component this will also happen after PNG_COMPOSE and so the background
       * color must be pre-expanded here.
       *
       * TODO: fix this too.
       */
      png_ptr->background.red = (png_uint_16)(png_ptr->background.red * 257);
      png_ptr->background.green =
         (png_uint_16)(png_ptr->background.green * 257);
      png_ptr->background.blue = (png_uint_16)(png_ptr->background.blue * 257);
      png_ptr->background.gray = (png_uint_16)(png_ptr->background.gray * 257);
   }
#endif

   /* NOTE: below 'PNG_READ_ALPHA_MODE_SUPPORTED' is presumed to also enable the
    * background support (see the comments in scripts/pnglibconf.dfa), this
    * allows pre-multiplication of the alpha channel to be implemented as
    * compositing on black.  This is probably sub-optimal and has been done in
    * 1.5.4 betas simply to enable external critique and testing (i.e. to
    * implement the new API quickly, without lots of internal changes.)
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
#  ifdef PNG_READ_BACKGROUND_SUPPORTED
      /* Includes ALPHA_MODE */
      png_ptr->background_1 = png_ptr->background;
#  endif

   /* This needs to change - in the palette image case a whole set of tables are
    * built when it would be quicker to just calculate the correct value for
    * each palette entry directly.  Also, the test is too tricky - why check
    * PNG_RGB_TO_GRAY if PNG_GAMMA is not set?  The answer seems to be that
    * PNG_GAMMA is cancelled even if the gamma is known?  The test excludes the
    * PNG_COMPOSE case, so apparently if there is no *overall* gamma correction
    * the gamma tables will not be built even if composition is required on a
    * gamma encoded value.
    *
    * In 1.5.4 this is addressed below by an additional check on the individual
    * file gamma - if it is not 1.0 both RGB_TO_GRAY and COMPOSE need the
    * tables.
    */
   if ((png_ptr->transformations & PNG_GAMMA) != 0 ||
       ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0 &&
        (png_gamma_significant(png_ptr->colorspace.gamma) != 0 ||
         png_gamma_significant(png_ptr->screen_gamma) != 0)) ||
        ((png_ptr->transformations & PNG_COMPOSE) != 0 &&
         (png_gamma_significant(png_ptr->colorspace.gamma) != 0 ||
          png_gamma_significant(png_ptr->screen_gamma) != 0
#  ifdef PNG_READ_BACKGROUND_SUPPORTED
         || (png_ptr->background_gamma_type == PNG_BACKGROUND_GAMMA_UNIQUE &&
           png_gamma_significant(png_ptr->background_gamma) != 0)
#  endif
        )) || ((png_ptr->transformations & PNG_ENCODE_ALPHA) != 0 &&
       png_gamma_significant(png_ptr->screen_gamma) != 0))
   {
      png_build_gamma_table(png_ptr, png_ptr->bit_depth);

#ifdef PNG_READ_BACKGROUND_SUPPORTED
      if ((png_ptr->transformations & PNG_COMPOSE) != 0)
      {
         /* Issue a warning about this combination: because RGB_TO_GRAY is
          * optimized to do the gamma transform if present yet do_background has
          * to do the same thing if both options are set a
          * double-gamma-correction happens.  This is true in all versions of
          * libpng to date.
          */
         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
            png_warning(png_ptr,
                "libpng does not support gamma+background+rgb_to_gray");

         if ((png_ptr->color_type == PNG_COLOR_TYPE_PALETTE) != 0)
         {
            /* We don't get to here unless there is a tRNS chunk with non-opaque
             * entries - see the checking code at the start of this function.
             */
            png_color back, back_1;
            png_colorp palette = png_ptr->palette;
            int num_palette = png_ptr->num_palette;
            int i;
            if (png_ptr->background_gamma_type == PNG_BACKGROUND_GAMMA_FILE)
            {

               back.red = png_ptr->gamma_table[png_ptr->background.red];
               back.green = png_ptr->gamma_table[png_ptr->background.green];
               back.blue = png_ptr->gamma_table[png_ptr->background.blue];

               back_1.red = png_ptr->gamma_to_1[png_ptr->background.red];
               back_1.green = png_ptr->gamma_to_1[png_ptr->background.green];
               back_1.blue = png_ptr->gamma_to_1[png_ptr->background.blue];
            }
            else
            {
               png_fixed_point g, gs;

               switch (png_ptr->background_gamma_type)
               {
                  case PNG_BACKGROUND_GAMMA_SCREEN:
                     g = (png_ptr->screen_gamma);
                     gs = PNG_FP_1;
                     break;

                  case PNG_BACKGROUND_GAMMA_FILE:
                     g = png_reciprocal(png_ptr->colorspace.gamma);
                     gs = png_reciprocal2(png_ptr->colorspace.gamma,
                         png_ptr->screen_gamma);
                     break;

                  case PNG_BACKGROUND_GAMMA_UNIQUE:
                     g = png_reciprocal(png_ptr->background_gamma);
                     gs = png_reciprocal2(png_ptr->background_gamma,
                         png_ptr->screen_gamma);
                     break;
                  default:
                     g = PNG_FP_1;    /* back_1 */
                     gs = PNG_FP_1;   /* back */
                     break;
               }

               if (png_gamma_significant(gs) != 0)
               {
                  back.red = png_gamma_8bit_correct(png_ptr->background.red,
                      gs);
                  back.green = png_gamma_8bit_correct(png_ptr->background.green,
                      gs);
                  back.blue = png_gamma_8bit_correct(png_ptr->background.blue,
                      gs);
               }

               else
               {
                  back.red   = (png_byte)png_ptr->background.red;
                  back.green = (png_byte)png_ptr->background.green;
                  back.blue  = (png_byte)png_ptr->background.blue;
               }

               if (png_gamma_significant(g) != 0)
               {
                  back_1.red = png_gamma_8bit_correct(png_ptr->background.red,
                      g);
                  back_1.green = png_gamma_8bit_correct(
                      png_ptr->background.green, g);
                  back_1.blue = png_gamma_8bit_correct(png_ptr->background.blue,
                      g);
               }

               else
               {
                  back_1.red   = (png_byte)png_ptr->background.red;
                  back_1.green = (png_byte)png_ptr->background.green;
                  back_1.blue  = (png_byte)png_ptr->background.blue;
               }
            }

            for (i = 0; i < num_palette; i++)
            {
               if (i < (int)png_ptr->num_trans &&
                   png_ptr->trans_alpha[i] != 0xff)
               {
                  if (png_ptr->trans_alpha[i] == 0)
                  {
                     palette[i] = back;
                  }
                  else /* if (png_ptr->trans_alpha[i] != 0xff) */
                  {
                     png_byte v, w;

                     v = png_ptr->gamma_to_1[palette[i].red];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.red);
                     palette[i].red = png_ptr->gamma_from_1[w];

                     v = png_ptr->gamma_to_1[palette[i].green];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.green);
                     palette[i].green = png_ptr->gamma_from_1[w];

                     v = png_ptr->gamma_to_1[palette[i].blue];
                     png_composite(w, v, png_ptr->trans_alpha[i], back_1.blue);
                     palette[i].blue = png_ptr->gamma_from_1[w];
                  }
               }
               else
               {
                  palette[i].red = png_ptr->gamma_table[palette[i].red];
                  palette[i].green = png_ptr->gamma_table[palette[i].green];
                  palette[i].blue = png_ptr->gamma_table[palette[i].blue];
               }
            }

            /* Prevent the transformations being done again.
             *
             * NOTE: this is highly dubious; it removes the transformations in
             * place.  This seems inconsistent with the general treatment of the
             * transformations elsewhere.
             */
            png_ptr->transformations &= ~(PNG_COMPOSE | PNG_GAMMA);
         } /* color_type == PNG_COLOR_TYPE_PALETTE */

         /* if (png_ptr->background_gamma_type!=PNG_BACKGROUND_GAMMA_UNKNOWN) */
         else /* color_type != PNG_COLOR_TYPE_PALETTE */
         {
            int gs_sig, g_sig;
            png_fixed_point g = PNG_FP_1;  /* Correction to linear */
            png_fixed_point gs = PNG_FP_1; /* Correction to screen */

            switch (png_ptr->background_gamma_type)
            {
               case PNG_BACKGROUND_GAMMA_SCREEN:
                  g = png_ptr->screen_gamma;
                  /* gs = PNG_FP_1; */
                  break;

               case PNG_BACKGROUND_GAMMA_FILE:
                  g = png_reciprocal(png_ptr->colorspace.gamma);
                  gs = png_reciprocal2(png_ptr->colorspace.gamma,
                      png_ptr->screen_gamma);
                  break;

               case PNG_BACKGROUND_GAMMA_UNIQUE:
                  g = png_reciprocal(png_ptr->background_gamma);
                  gs = png_reciprocal2(png_ptr->background_gamma,
                      png_ptr->screen_gamma);
                  break;

               default:
                  png_error(png_ptr, "invalid background gamma type");
            }

            g_sig = png_gamma_significant(g);
            gs_sig = png_gamma_significant(gs);

            if (g_sig != 0)
               png_ptr->background_1.gray = png_gamma_correct(png_ptr,
                   png_ptr->background.gray, g);

            if (gs_sig != 0)
               png_ptr->background.gray = png_gamma_correct(png_ptr,
                   png_ptr->background.gray, gs);

            if ((png_ptr->background.red != png_ptr->background.green) ||
                (png_ptr->background.red != png_ptr->background.blue) ||
                (png_ptr->background.red != png_ptr->background.gray))
            {
               /* RGB or RGBA with color background */
               if (g_sig != 0)
               {
                  png_ptr->background_1.red = png_gamma_correct(png_ptr,
                      png_ptr->background.red, g);

                  png_ptr->background_1.green = png_gamma_correct(png_ptr,
                      png_ptr->background.green, g);

                  png_ptr->background_1.blue = png_gamma_correct(png_ptr,
                      png_ptr->background.blue, g);
               }

               if (gs_sig != 0)
               {
                  png_ptr->background.red = png_gamma_correct(png_ptr,
                      png_ptr->background.red, gs);

                  png_ptr->background.green = png_gamma_correct(png_ptr,
                      png_ptr->background.green, gs);

                  png_ptr->background.blue = png_gamma_correct(png_ptr,
                      png_ptr->background.blue, gs);
               }
            }

            else
            {
               /* GRAY, GRAY ALPHA, RGB, or RGBA with gray background */
               png_ptr->background_1.red = png_ptr->background_1.green
                   = png_ptr->background_1.blue = png_ptr->background_1.gray;

               png_ptr->background.red = png_ptr->background.green
                   = png_ptr->background.blue = png_ptr->background.gray;
            }

            /* The background is now in screen gamma: */
            png_ptr->background_gamma_type = PNG_BACKGROUND_GAMMA_SCREEN;
         } /* color_type != PNG_COLOR_TYPE_PALETTE */
      }/* png_ptr->transformations & PNG_BACKGROUND */

      else
      /* Transformation does not include PNG_BACKGROUND */
#endif /* READ_BACKGROUND */
      if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE
#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
         /* RGB_TO_GRAY needs to have non-gamma-corrected values! */
         && ((png_ptr->transformations & PNG_EXPAND) == 0 ||
         (png_ptr->transformations & PNG_RGB_TO_GRAY) == 0)
#endif
         )
      {
         png_colorp palette = png_ptr->palette;
         int num_palette = png_ptr->num_palette;
         int i;

         /* NOTE: there are other transformations that should probably be in
          * here too.
          */
         for (i = 0; i < num_palette; i++)
         {
            palette[i].red = png_ptr->gamma_table[palette[i].red];
            palette[i].green = png_ptr->gamma_table[palette[i].green];
            palette[i].blue = png_ptr->gamma_table[palette[i].blue];
         }

         /* Done the gamma correction. */
         png_ptr->transformations &= ~PNG_GAMMA;
      } /* color_type == PALETTE && !PNG_BACKGROUND transformation */
   }
#ifdef PNG_READ_BACKGROUND_SUPPORTED
   else
#endif
#endif /* READ_GAMMA */

#ifdef PNG_READ_BACKGROUND_SUPPORTED
   /* No GAMMA transformation (see the hanging else 4 lines above) */
   if ((png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE))
   {
      int i;
      int istop = (int)png_ptr->num_trans;
      png_color back;
      png_colorp palette = png_ptr->palette;

      back.red   = (png_byte)png_ptr->background.red;
      back.green = (png_byte)png_ptr->background.green;
      back.blue  = (png_byte)png_ptr->background.blue;

      for (i = 0; i < istop; i++)
      {
         if (png_ptr->trans_alpha[i] == 0)
         {
            palette[i] = back;
         }

         else if (png_ptr->trans_alpha[i] != 0xff)
         {
            /* The png_composite() macro is defined in png.h */
            png_composite(palette[i].red, palette[i].red,
                png_ptr->trans_alpha[i], back.red);

            png_composite(palette[i].green, palette[i].green,
                png_ptr->trans_alpha[i], back.green);

            png_composite(palette[i].blue, palette[i].blue,
                png_ptr->trans_alpha[i], back.blue);
         }
      }

      png_ptr->transformations &= ~PNG_COMPOSE;
   }
#endif /* READ_BACKGROUND */

#ifdef PNG_READ_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0 &&
       (png_ptr->transformations & PNG_EXPAND) == 0 &&
       (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE))
   {
      int i;
      int istop = png_ptr->num_palette;
      int shift = 8 - png_ptr->sig_bit.red;

      png_ptr->transformations &= ~PNG_SHIFT;

      /* significant bits can be in the range 1 to 7 for a meaninful result, if
       * the number of significant bits is 0 then no shift is done (this is an
       * error condition which is silently ignored.)
       */
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].red;

            component >>= shift;
            png_ptr->palette[i].red = (png_byte)component;
         }

      shift = 8 - png_ptr->sig_bit.green;
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].green;

            component >>= shift;
            png_ptr->palette[i].green = (png_byte)component;
         }

      shift = 8 - png_ptr->sig_bit.blue;
      if (shift > 0 && shift < 8)
         for (i=0; i<istop; ++i)
         {
            int component = png_ptr->palette[i].blue;

            component >>= shift;
            png_ptr->palette[i].blue = (png_byte)component;
         }
   }
#endif /* READ_SHIFT */
}